

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_debug.c
# Opt level: O2

int jas_memdump(FILE *out,void *data,size_t len)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  for (uVar3 = 0; uVar3 < len; uVar3 = uVar3 + 0x10) {
    fprintf((FILE *)out,"%04zx:",uVar3);
    lVar1 = 0x10;
    uVar2 = uVar3;
    while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
      if (uVar2 < len) {
        fprintf((FILE *)out," %02x",(ulong)*(byte *)((long)data + uVar2));
      }
      uVar2 = uVar2 + 1;
    }
    fputc(10,(FILE *)out);
  }
  return 0;
}

Assistant:

int jas_memdump(FILE *out, void *data, size_t len)
{
	size_t i;
	size_t j;
	jas_uchar *dp;
	dp = data;
	for (i = 0; i < len; i += 16) {
		fprintf(out, "%04zx:", i);
		for (j = 0; j < 16; ++j) {
			if (i + j < len) {
				fprintf(out, " %02x", dp[i + j]);
			}
		}
		fprintf(out, "\n");
	}
	return 0;
}